

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_get_weight(wally_tx *tx,size_t *written)

{
  int iVar1;
  int iVar2;
  size_t is_elements;
  size_t witness_count;
  size_t witness_size;
  size_t base_size;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  
  local_38 = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = wally_tx_is_elements(tx,&local_38);
  iVar2 = -2;
  if ((written != (size_t *)0x0) && (iVar1 == 0)) {
    iVar1 = tx_get_lengths(tx,(tx_serialize_opts *)0x0,1,&local_20,&local_28,&local_30,local_38 != 0
                          );
    if (iVar1 == 0) {
      if (local_30 != 0) {
        local_30 = local_28;
      }
      *written = local_30 + local_20 * 4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int wally_tx_get_weight(const struct wally_tx *tx, size_t *written)
{
    size_t base_size, witness_size, witness_count;
    size_t is_elements = 0;

    if (written)
        *written = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif

    if (!written ||
        tx_get_lengths(tx, NULL, WALLY_TX_FLAG_USE_WITNESS, &base_size,
                       &witness_size, &witness_count, is_elements != 0) != WALLY_OK)
        return WALLY_EINVAL;

    if (witness_count)
        *written = base_size * 4 + witness_size;
    else
        *written = base_size * 4;

    return WALLY_OK;
}